

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O0

shared_ptr<mnf::Manifold> __thiscall mnf::RealSpace::getNewCopy_(RealSpace *this)

{
  RealSpace *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RealSpace *in_RSI;
  shared_ptr<mnf::Manifold> sVar1;
  undefined1 local_28 [8];
  shared_ptr<mnf::RealSpace> copy;
  RealSpace *this_local;
  
  this_00 = (RealSpace *)operator_new(0x78);
  RealSpace(this_00,in_RSI);
  std::shared_ptr<mnf::RealSpace>::shared_ptr<mnf::RealSpace,void>
            ((shared_ptr<mnf::RealSpace> *)local_28,this_00);
  std::shared_ptr<mnf::Manifold>::shared_ptr<mnf::RealSpace,void>
            ((shared_ptr<mnf::Manifold> *)this,(shared_ptr<mnf::RealSpace> *)local_28);
  std::shared_ptr<mnf::RealSpace>::~shared_ptr((shared_ptr<mnf::RealSpace> *)local_28);
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> RealSpace::getNewCopy_() const
{
  std::shared_ptr<RealSpace> copy(new RealSpace(*this));
  return copy;
}